

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O1

void __thiscall
cmCursesLongMessageForm::cmCursesLongMessageForm
          (cmCursesLongMessageForm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages,char *title)

{
  pointer pbVar1;
  char *pcVar2;
  string *message;
  pointer pbVar3;
  
  cmCursesForm::cmCursesForm(&this->super_cmCursesForm);
  (this->super_cmCursesForm)._vptr_cmCursesForm =
       (_func_int **)&PTR__cmCursesLongMessageForm_005bbec8;
  (this->Messages)._M_dataplus._M_p = (pointer)&(this->Messages).field_2;
  (this->Messages)._M_string_length = 0;
  (this->Messages).field_2._M_local_buf[0] = '\0';
  (this->Title)._M_dataplus._M_p = (pointer)&(this->Title).field_2;
  (this->Title)._M_string_length = 0;
  (this->Title).field_2._M_local_buf[0] = '\0';
  pbVar1 = (messages->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (messages->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::_M_append((char *)&this->Messages,(ulong)(pbVar3->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&this->Messages);
  }
  pcVar2 = (char *)(this->Title)._M_string_length;
  strlen(title);
  std::__cxx11::string::_M_replace((ulong)&this->Title,0,pcVar2,(ulong)title);
  this->Fields[0] = (FIELD *)0x0;
  this->Fields[1] = (FIELD *)0x0;
  return;
}

Assistant:

cmCursesLongMessageForm::cmCursesLongMessageForm(
  std::vector<std::string> const& messages, const char* title)
{
  // Append all messages into on big string
  for (std::string const& message : messages) {
    this->Messages += message;
    // Add one blank line after each message
    this->Messages += "\n\n";
  }
  this->Title = title;
  this->Fields[0] = nullptr;
  this->Fields[1] = nullptr;
}